

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O0

int __thiscall
CGraphicsBackend_SDL_OpenGL::GetVideoModes
          (CGraphicsBackend_SDL_OpenGL *this,CVideoMode *pModes,int MaxModes,int Screen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined4 in_ECX;
  int in_EDX;
  long in_RSI;
  long in_FS_OFFSET;
  int j;
  bool AlreadyFound;
  int i;
  int ModesCount;
  int NumModes;
  SDL_DisplayMode Mode;
  int local_54;
  int local_4c;
  int local_48;
  int local_24;
  undefined1 local_20 [4];
  int local_1c;
  int local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = SDL_GetNumDisplayModes(in_ECX);
  if (iVar2 < 0) {
    uVar4 = SDL_GetError();
    dbg_msg("gfx","unable to get the number of display modes: %s",uVar4);
    local_24 = 0;
  }
  else {
    local_48 = 0;
    for (local_4c = 0; local_4c < iVar2 && local_48 < in_EDX; local_4c = local_4c + 1) {
      iVar3 = SDL_GetDisplayMode(in_ECX,local_4c,local_20);
      if (iVar3 < 0) {
        uVar4 = SDL_GetError();
        dbg_msg("gfx","unable to get display mode: %s",uVar4);
      }
      else {
        bVar1 = false;
        for (local_54 = 0; local_54 < local_48; local_54 = local_54 + 1) {
          if ((*(int *)(in_RSI + (long)local_54 * 8) == local_1c) &&
             (*(int *)(in_RSI + 4 + (long)local_54 * 8) == local_18)) {
            bVar1 = true;
            break;
          }
        }
        if (!bVar1) {
          *(int *)(in_RSI + (long)local_48 * 8) = local_1c;
          *(int *)(in_RSI + 4 + (long)local_48 * 8) = local_18;
          local_48 = local_48 + 1;
        }
      }
    }
    local_24 = local_48;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

int CGraphicsBackend_SDL_OpenGL::GetVideoModes(CVideoMode *pModes, int MaxModes, int Screen)
{
	int NumModes = SDL_GetNumDisplayModes(Screen);
	if(NumModes < 0)
	{
		dbg_msg("gfx", "unable to get the number of display modes: %s", SDL_GetError());
		return 0;
	}

	int ModesCount = 0;
	for(int i = 0; i < NumModes && ModesCount < MaxModes; i++)
	{
		SDL_DisplayMode Mode;
		if(SDL_GetDisplayMode(Screen, i, &Mode) < 0)
		{
			dbg_msg("gfx", "unable to get display mode: %s", SDL_GetError());
			continue;
		}

		bool AlreadyFound = false;
		for(int j = 0; j < ModesCount; j++)
		{
			if(pModes[j].m_Width == Mode.w && pModes[j].m_Height == Mode.h)
			{
				AlreadyFound = true;
				break;
			}
		}
		if(AlreadyFound)
			continue;

		pModes[ModesCount].m_Width = Mode.w;
		pModes[ModesCount].m_Height = Mode.h;
		ModesCount++;
	}
	return ModesCount;
}